

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::FunctionBody::GetStatementIndexAndLengthAt
          (FunctionBody *this,int byteCodeOffset,UINT32 *statementIndex,UINT32 *statementLength)

{
  byte bVar1;
  SRCINFO *pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  StatementMap *pSVar7;
  Utf8SourceInfo *pUVar8;
  
  if (statementIndex == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd8,"(statementIndex != nullptr)","statementIndex != nullptr");
    if (!bVar4) goto LAB_00763e2f;
    *puVar6 = 0;
  }
  if (statementLength == (UINT32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcd9,"(statementLength != nullptr)","statementLength != nullptr");
    if (!bVar4) goto LAB_00763e2f;
    *puVar6 = 0;
  }
  pUVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar1 = pUVar8->field_0xa8;
  if ((byte)((bVar1 >> 5 | (pUVar8->debugModeSource).ptr != (uchar *)0x0) & (bVar1 & 0x40) >> 6) ==
      0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcdb,"(this->IsInDebugMode())","this->IsInDebugMode()");
    if (!bVar4) goto LAB_00763e2f;
    *puVar6 = 0;
  }
  pSVar7 = GetEnclosingStatementMapFromByteCode(this,byteCodeOffset,false);
  if (pSVar7 == (StatementMap *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xcde,"(statement != nullptr)","statement != nullptr");
    if (!bVar4) {
LAB_00763e2f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  else {
    pUVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    if (pUVar8 == (Utf8SourceInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xce7,"(m_utf8SourceInfo)","m_utf8SourceInfo");
      if (!bVar4) goto LAB_00763e2f;
      *puVar6 = 0;
      pUVar8 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    }
    pSVar2 = (pUVar8->m_srcInfo).ptr;
    if (pSVar2 == (SRCINFO *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = pSVar2->ulCharOffset - pSVar2->ichMinHost;
    }
    *statementIndex = iVar5 + (pSVar7->sourceSpan).begin;
    *statementLength = (pSVar7->sourceSpan).end - (pSVar7->sourceSpan).begin;
  }
  return pSVar7 != (StatementMap *)0x0;
}

Assistant:

bool FunctionBody::GetStatementIndexAndLengthAt(int byteCodeOffset, UINT32* statementIndex, UINT32* statementLength)
    {
        Assert(statementIndex != nullptr);
        Assert(statementLength != nullptr);

        Assert(this->IsInDebugMode());

        StatementMap * statement = GetEnclosingStatementMapFromByteCode(byteCodeOffset, false);
        Assert(statement != nullptr);

        // Bailout if we are unable to find a statement.
        // We shouldn't be missing these when a debugger is attached but we don't want to AV on retail builds.
        if (statement == nullptr)
        {
            return false;
        }

        Assert(m_utf8SourceInfo);
        const SRCINFO * srcInfo = GetUtf8SourceInfo()->GetSrcInfo();

        // Offset from the beginning of the document minus any host-supplied source characters.
        // Host supplied characters are inserted (for example) around onload:
        //      onload="foo('somestring', 0)" -> function onload(event).{.foo('somestring', 0).}
        ULONG offsetFromDocumentBegin = srcInfo ? srcInfo->ulCharOffset - srcInfo->ichMinHost : 0;

        *statementIndex = statement->sourceSpan.Begin() + offsetFromDocumentBegin;
        *statementLength = statement->sourceSpan.End() - statement->sourceSpan.Begin();
        return true;
    }